

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

uint32 __thiscall Clasp::Asp::PrgBody::findLit(PrgBody *this,LogicProgram *prg,Literal p)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = *(uint *)&this->field_0x8;
  if ((uVar1 & 0x1ffffff) != 0) {
    uVar3 = (ulong)((uVar1 & 0x1ffffff) << 2);
    lVar4 = 0;
    do {
      uVar2 = *(uint *)(&(&this[1].super_PrgNode)[(uVar1 & 0x18000000) != 0].field_0x0 + lVar4 * 4);
      if ((uVar2 & 2 ^ p.rep_ ^
          *(int *)&((prg->atoms_).ebo_.buf[uVar2 >> 2]->super_PrgHead).super_PrgNode * 2) < 2) {
        return (uint32)lVar4;
      }
      lVar4 = lVar4 + 1;
      uVar3 = uVar3 - 4;
    } while (uVar3 != 0);
  }
  return 0x40000000;
}

Assistant:

uint32 PrgBody::findLit(const LogicProgram& prg, Literal p) const {
	for (const Literal* it = goals_begin(), *end = it + size(); it != end; ++it) {
		Literal x = prg.getAtom(it->var())->literal();
		if (it->sign()) x = ~x;
		if (x == p) return static_cast<uint32>(it - goals_begin());
	}
	return varMax;
}